

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall DebuggerHost::~DebuggerHost(DebuggerHost *this)

{
  operator_delete(this);
  return;
}

Assistant:

void onBreakPoint(cha::d::BreakPointId breakPointId) override {
		BreakPointState b;
		{
			std::lock_guard<cha::SpinLock> lock0(lockBreak);
			auto it = std::find_if(breakPoints.cbegin(), breakPoints.cend(), [&](const BreakPointState& bs) {
				return bs.breakPointId == breakPointId;
			});
			if (it != breakPoints.cend())
				b = *it;
		}
		if (b.breakPointId == static_cast<cha::d::BreakPointId>(std::numeric_limits<size_t>::max()))
			dError("[reached to unknown breakpoint B%zu]", static_cast<size_t>(breakPointId));
		else {
			dLog(0, "[reached to breakpoint B%zu]", static_cast<size_t>(breakPointId));
			dLog(1, "B%zu %s", static_cast<size_t>(breakPointId), formatCodePoint(b.codePoint).data());
		}

		cvBreak.notify_one();
	}